

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_value.c
# Opt level: O0

void gravity_function_array_serialize(gravity_function_t *f,json_t *json,gravity_value_r r)

{
  gravity_value_t v;
  size_t i;
  size_t n;
  json_t *json_local;
  gravity_function_t *f_local;
  
  if (f->tag == EXEC_TYPE_NATIVE) {
    for (v.field_1.n = 0; v.field_1.p < r.n;
        v.field_1.p = (gravity_object_t *)((long)&(v.field_1.p)->isa + 1)) {
      gravity_value_serialize((char *)0x0,r.p[v.field_1.n],json);
    }
    return;
  }
  __assert_fail("f->tag == EXEC_TYPE_NATIVE",
                "/workspace/llm4binary/github/license_c_cmakelists/marcobambini[P]gravity/src/shared/gravity_value.c"
                ,0x23a,
                "void gravity_function_array_serialize(gravity_function_t *, json_t *, gravity_value_r)"
               );
}

Assistant:

static void gravity_function_array_serialize (gravity_function_t *f, json_t *json, gravity_value_r r) {
    assert(f->tag == EXEC_TYPE_NATIVE);
    size_t n = marray_size(r);

    for (size_t i=0; i<n; i++) {
        gravity_value_t v = marray_get(r, i);
        gravity_value_serialize(NULL, v, json);
    }
}